

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwSetWindowSize(GLFWwindow *handle,int width,int height)

{
  _GLFWwindow *window;
  int height_local;
  int width_local;
  GLFWwindow *handle_local;
  
  if (handle != (GLFWwindow *)0x0) {
    if (_glfwInitialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      *(int *)(handle + 0x28) = width;
      *(int *)(handle + 0x2c) = height;
      _glfwPlatformSetWindowSize((_GLFWwindow *)handle,width,height);
    }
    return;
  }
  __assert_fail("window != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Wei-Parker-Guo[P]PhongSphere/glfw-3.2.1/src/window.c"
                ,0x1ee,"void glfwSetWindowSize(GLFWwindow *, int, int)");
}

Assistant:

GLFWAPI void glfwSetWindowSize(GLFWwindow* handle, int width, int height)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    window->videoMode.width  = width;
    window->videoMode.height = height;

    _glfwPlatformSetWindowSize(window, width, height);
}